

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

int __thiscall
mp::internal::TextReader<fmt::Locale>::ReadUInt(TextReader<fmt::Locale> *this,int *accumulator)

{
  uint uVar1;
  int iVar2;
  
  uVar1 = ReadUInt<int>(this);
  iVar2 = *accumulator;
  if ((int)(uVar1 ^ 0x7fffffff) < iVar2) {
    ReportError<>(this,(CStringRef)0x15a0c9);
    iVar2 = *accumulator;
  }
  *accumulator = iVar2 + uVar1;
  return uVar1;
}

Assistant:

int ReadUInt(int &accumulator) {
    int value = ReadUInt();
    if (accumulator > std::numeric_limits<int>::max() - value)
      ReportError("integer overflow");
    accumulator += value;
    return value;
  }